

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_store(REF_DICT ref_dict,REF_INT key,REF_INT value)

{
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uStack_30;
  
  uVar2 = ref_dict->n;
  if (ref_dict->max == uVar2) {
    ref_dict->max = ref_dict->max + 1000;
    fflush(_stdout);
    pRVar4 = ref_dict->key;
    if (0 < (long)ref_dict->max) {
      pRVar4 = (REF_INT *)realloc(pRVar4,(long)ref_dict->max << 2);
      ref_dict->key = pRVar4;
    }
    if (pRVar4 == (REF_INT *)0x0) {
      pcVar8 = "realloc ref_dict->key NULL";
      uStack_30 = 0x52;
    }
    else {
      fflush(_stdout);
      pRVar4 = ref_dict->value;
      if (0 < (long)ref_dict->max) {
        pRVar4 = (REF_INT *)realloc(pRVar4,(long)ref_dict->max << 2);
        ref_dict->value = pRVar4;
      }
      if (pRVar4 != (REF_INT *)0x0) {
        uVar2 = ref_dict->n;
        goto LAB_0015adf7;
      }
      pcVar8 = "realloc ref_dict->value NULL";
      uStack_30 = 0x53;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
           uStack_30,"ref_dict_store",pcVar8);
    uVar2 = ref_dict->max;
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)uVar2,(long)(int)uVar2,
           4,(long)(int)uVar2 * 4);
    RVar3 = 2;
  }
  else {
LAB_0015adf7:
    uVar6 = (ulong)uVar2;
    uVar1 = uVar2;
    do {
      uVar5 = uVar1;
      uVar6 = uVar6 - 1;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
        break;
      }
      if (ref_dict->key[uVar6] == key) {
        ref_dict->value[uVar6] = value;
        goto LAB_0015ae6a;
      }
      uVar1 = uVar5 - 1;
    } while (key <= ref_dict->key[uVar6]);
    uVar6 = (ulong)uVar5;
    for (lVar7 = (long)(int)uVar2; (long)uVar6 < lVar7; lVar7 = lVar7 + -1) {
      ref_dict->key[lVar7] = ref_dict->key[lVar7 + -1];
    }
    for (lVar7 = (long)ref_dict->n; (long)uVar6 < lVar7; lVar7 = lVar7 + -1) {
      ref_dict->value[lVar7] = ref_dict->value[lVar7 + -1];
    }
    ref_dict->n = ref_dict->n + 1;
    ref_dict->key[uVar6] = key;
    ref_dict->value[uVar6] = value;
LAB_0015ae6a:
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_dict_store(REF_DICT ref_dict, REF_INT key,
                                  REF_INT value) {
  REF_INT i, insert_point;

  if (ref_dict_max(ref_dict) == ref_dict_n(ref_dict)) {
    ref_dict_max(ref_dict) += 1000;

    ref_realloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
    ref_realloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);
  }

  insert_point = 0;
  for (i = ref_dict_n(ref_dict) - 1; i >= 0; i--) {
    if (ref_dict->key[i] == key) {
      ref_dict->value[i] = value;
      return REF_SUCCESS;
    }
    if (ref_dict->key[i] < key) {
      insert_point = i + 1;
      break;
    }
  }
  /* shift to open up insert_point */
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->key[i] = ref_dict->key[i - 1];
  for (i = ref_dict_n(ref_dict); i > insert_point; i--)
    ref_dict->value[i] = ref_dict->value[i - 1];

  /* fill insert_point */
  ref_dict_n(ref_dict)++;
  ref_dict->key[insert_point] = key;
  ref_dict->value[insert_point] = value;

  return REF_SUCCESS;
}